

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  in_addr_t iVar2;
  int iVar3;
  ostream *poVar4;
  RTPPacket *p;
  uint uVar5;
  RTPTime RStack_10930;
  string ipstr;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams RStack_10860;
  RTPIPv4Address addr;
  RTPSession sess;
  
  jrtplib::RTPSession::RTPSession(&sess,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ipstr,"0.0.0.0",(allocator<char> *)&sessparams);
  poVar4 = std::operator<<((ostream *)&std::cout,"Using version ");
  RStack_10860.super_RTPTransmissionParams._0_12_ = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_
            ((string *)&sessparams,(RTPLibraryVersion *)&RStack_10860);
  poVar4 = std::operator<<(poVar4,(string *)&sessparams);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&sessparams);
  iVar2 = inet_addr(ipstr._M_dataplus._M_p);
  RStack_10860.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)((long)&RStack_10860 + 0x18);
  RStack_10860.super_RTPTransmissionParams._0_12_ = ZEXT812(0x143060);
  RStack_10860.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node._M_size = 0;
  RStack_10860.super_RTPTransmissionParams._12_2_ = 5000;
  RStack_10860.bindIP = 0;
  RStack_10860.mcastifaceIP = 0;
  RStack_10860.multicastTTL = '\x01';
  RStack_10860.rtpsendbuf = 0x8000;
  RStack_10860.rtprecvbuf = 0x8000;
  RStack_10860.rtcpsendbuf = 0x8000;
  RStack_10860.rtcprecvbuf = 0x8000;
  RStack_10860.m_pAbortDesc = (RTPAbortDescriptors *)0x0;
  RStack_10860._68_5_ = 0;
  RStack_10860.rtpsock._1_3_ = 0;
  RStack_10860.rtcpsock = 0;
  RStack_10860.useexistingsockets = false;
  RStack_10860.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       RStack_10860.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  jrtplib::RTPSessionParams::RTPSessionParams(&sessparams);
  sessparams.owntsunit = 0.1;
  sessparams.acceptown = true;
  RStack_10860.super_RTPTransmissionParams._12_2_ = 8000;
  iVar3 = jrtplib::RTPSession::Create
                    (&sess,&sessparams,&RStack_10860.super_RTPTransmissionParams,IPv4UDPProto);
  checkerror(iVar3);
  addr.super_RTPAddress._12_4_ =
       iVar2 >> 0x18 | (iVar2 & 0xff0000) >> 8 | (iVar2 & 0xff00) << 8 | iVar2 << 0x18;
  addr.super_RTPAddress.addresstype = IPv4Address;
  addr.super_RTPAddress._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00143d10;
  addr.port = 10000;
  addr.rtcpsendport = 0x2711;
  iVar3 = jrtplib::RTPSession::AddDestination(&sess,&addr.super_RTPAddress);
  checkerror(iVar3);
  for (uVar5 = 1; uVar5 != 0x65; uVar5 = uVar5 + 1) {
    printf("\nSending packet %d/%d\n",(ulong)uVar5,100);
    iVar3 = jrtplib::RTPSession::SendPacket(&sess,"1234567890",10,'\0',false,10);
    checkerror(iVar3);
    jrtplib::RTPSession::BeginDataAccess(&sess);
    bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData(&sess);
    while (bVar1 != false) {
      while( true ) {
        p = jrtplib::RTPSession::GetNextPacket(&sess);
        if (p == (RTPPacket *)0x0) break;
        puts("Got packet !");
        jrtplib::RTPSession::DeletePacket(&sess,p);
      }
      bVar1 = jrtplib::RTPSession::GotoNextSourceWithData(&sess);
    }
    jrtplib::RTPSession::EndDataAccess(&sess);
    iVar3 = jrtplib::RTPSession::Poll(&sess);
    checkerror(iVar3);
    RStack_10930.m_t = 1.0;
    jrtplib::RTPTime::Wait(&RStack_10930);
  }
  RStack_10930.m_t = 10.0;
  jrtplib::RTPSession::BYEDestroy(&sess,&RStack_10930,(void *)0x0,0);
  std::__cxx11::string::~string((string *)&sessparams.cname);
  jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams(&RStack_10860);
  std::__cxx11::string::~string((string *)&ipstr);
  jrtplib::RTPSession::~RTPSession(&sess);
  return 0;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	RTPSession sess;
	uint16_t portbase = 8000;
	std::string ipstr = "0.0.0.0";
	uint16_t destport = 10000;
	uint32_t destip;
	int status,i;
	int num = 100;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	destip = inet_addr(ipstr.c_str());
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}